

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emr_test.cc
# Opt level: O0

int test_list_execute_plans(void)

{
  code *pcVar1;
  char *__s;
  EmrListExecutePlansRequestType *pEVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1b1;
  int ret;
  HttpTestListener *local_190;
  HttpTestListener *listener;
  string local_180;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  EmrListExecutePlansRequestType *local_d8;
  Emr *emr;
  EmrListExecutePlansResponseType resp;
  EmrListExecutePlansRequestType req;
  
  aliyun::EmrListExecutePlansRequestType::EmrListExecutePlansRequestType
            ((EmrListExecutePlansRequestType *)&resp.page_size);
  aliyun::EmrListExecutePlansResponseType::EmrListExecutePlansResponseType
            ((EmrListExecutePlansResponseType *)&emr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"cn-hangzhou",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_appid",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"my_secret",&local_159);
  pEVar2 = (EmrListExecutePlansRequestType *)
           aliyun::Emr::CreateEmrClient(local_f8,local_130,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = pEVar2;
  if (pEVar2 == (EmrListExecutePlansRequestType *)0x0) {
    aliyun::EmrListExecutePlansResponseType::~EmrListExecutePlansResponseType
              ((EmrListExecutePlansResponseType *)&emr);
    aliyun::EmrListExecutePlansRequestType::~EmrListExecutePlansRequestType
              ((EmrListExecutePlansRequestType *)&resp.page_size);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetProxyHost((Emr *)pEVar2,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetUseTls((Emr *)local_d8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_list_execute_plans_response;
  local_190 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1b1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1b1);
  HttpTestListener::Start(local_190);
  std::__cxx11::string::operator=((string *)&resp.page_size,"Strategy");
  std::__cxx11::string::operator=((string *)(req.strategy.field_2._M_local_buf + 8),"Status");
  std::__cxx11::string::operator=((string *)(req.status.field_2._M_local_buf + 8),"IsDesc");
  std::__cxx11::string::operator=((string *)(req.is_desc.field_2._M_local_buf + 8),"PageNumber");
  std::__cxx11::string::operator=((string *)(req.page_number.field_2._M_local_buf + 8),"PageSize");
  aliyun::Emr::ListExecutePlans
            (local_d8,(EmrListExecutePlansResponseType *)&resp.page_size,(EmrErrorInfo *)&emr);
  HttpTestListener::WaitComplete(local_190);
  pHVar3 = local_190;
  if (local_190 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_190);
    operator_delete(pHVar3,0x180);
  }
  pEVar2 = local_d8;
  if (local_d8 != (EmrListExecutePlansRequestType *)0x0) {
    aliyun::Emr::~Emr((Emr *)local_d8);
    operator_delete(pEVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_list_execute_plans() {
  EmrListExecutePlansRequestType req;
  EmrListExecutePlansResponseType resp;
  Emr* emr = Emr::CreateEmrClient("cn-hangzhou", "my_appid", "my_secret");
  if(!emr) return 0;
  emr->SetProxyHost("127.0.0.1:12234");
  emr->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_list_execute_plans_response);
  listener->Start();
  req.strategy = "Strategy";
  req.status = "Status";
  req.is_desc = "IsDesc";
  req.page_number = "PageNumber";
  req.page_size = "PageSize";
  int ret = emr->ListExecutePlans(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete emr;
}